

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Page * pager_fetch_page(Pager *pPager,pgno page_num)

{
  Page *local_28;
  Page *pEntry;
  pgno page_num_local;
  Pager *pPager_local;
  
  if (pPager->nPage != 0) {
    for (local_28 = pPager->apHash[page_num & pPager->nSize - 1]; local_28 != (Page *)0x0;
        local_28 = local_28->pNextCollide) {
      if (local_28->pgno == page_num) {
        return local_28;
      }
    }
  }
  return (Page *)0x0;
}

Assistant:

static Page * pager_fetch_page(Pager *pPager,pgno page_num)
{
	Page *pEntry;
	if( pPager->nPage < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Perform the lookup */
	pEntry = pPager->apHash[PAGE_HASH(page_num) & (pPager->nSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->pgno == page_num ){
			return pEntry;
		}
		/* Point to the next entry in the colission chain */
		pEntry = pEntry->pNextCollide;
	}
	/* No such page */
	return 0;
}